

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

Matrix<float,_4,_4,_0,_4,_4> *
getGTTransformations<float>(Matrix<float,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  undefined1 auVar1 [12];
  DenseStorage<float,_16,_4,_4,_0> *pDVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  ActualDstType actualDst;
  undefined7 in_register_00000031;
  float fVar8;
  float fVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  int iVar14;
  float fVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Matrix<float,_3,_1,_0,_3,_1> tranGT;
  Matrix<float,_3,_3,_0,_3,_3> rotGT;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  RotationBase<Eigen::Quaternion<float,_0>,_3> *local_50;
  Matrix<float,3,3,0,3,3> local_44 [8];
  float afStack_3c [7];
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = 1.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[1] = 0.0;
  (pDVar2->m_data).array[2] = 0.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[3] = 0.0;
  (pDVar2->m_data).array[4] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = 1.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[6] = 0.0;
  (pDVar2->m_data).array[7] = 0.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[8] = 0.0;
  (pDVar2->m_data).array[9] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = 1.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[0xb] = 0.0;
  (pDVar2->m_data).array[0xc] = 0.0;
  pDVar2 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage;
  (pDVar2->m_data).array[0xd] = 0.0;
  (pDVar2->m_data).array[0xe] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = 1.0;
  uVar3 = rand();
  uVar4 = rand();
  iVar14 = (int)((ulong)uVar3 * 0x51eb851f >> 0x20) - (-(uint)((int)uVar3 < 0) & 0x51eb851f);
  iVar16 = (int)((ulong)uVar4 * 0x51eb851f >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x51eb851f);
  auVar11._0_8_ = (double)(int)(uVar3 + ((iVar14 >> 6) - (iVar14 >> 0x1f)) * -200);
  auVar11._8_8_ = (double)(int)(uVar4 + ((iVar16 >> 6) - (iVar16 >> 0x1f)) * -200);
  auVar11 = divpd(auVar11,_DAT_00203e50);
  iVar14 = rand();
  fVar8 = (float)(iVar14 % 200) / 5.0;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rand() angles = (",0x11);
    dVar10 = (double)(float)auVar11._0_8_;
    dVar13 = (double)(float)auVar11._8_8_;
    poVar5 = std::ostream::_M_insert<double>(dVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    uStack_94 = (undefined4)((ulong)dVar10 >> 0x20);
    uStack_90 = SUB84(dVar13,0);
    uStack_8c = (undefined4)((ulong)dVar13 >> 0x20);
    auVar1._4_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = uStack_94;
    auVar12._0_8_ = auVar1._0_8_ << 0x20;
    auVar12._8_4_ = uStack_90;
    auVar12._12_4_ = uStack_8c;
    poVar5 = std::ostream::_M_insert<double>(auVar12._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    poVar5 = std::ostream::_M_insert<double>((double)fVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_78 = ((fVar8 * 3.1415927) / 360.0) * 0.5;
  fVar8 = cosf(local_78);
  fStack_70 = sinf(local_78);
  local_78 = fStack_70 * 0.0;
  fVar9 = (((float)auVar11._8_8_ * 3.1415927) / 360.0) * 0.5;
  fStack_74 = local_78;
  fStack_6c = fVar8;
  local_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = fStack_70;
  fVar8 = cosf(fVar9);
  fVar9 = sinf(fVar9);
  fVar15 = fVar9 * 0.0;
  fVar17 = fVar15 * fStack_6c + fVar15 * fStack_64 + (fVar8 * local_78 - fVar9 * fStack_60);
  fVar18 = fVar9 * fStack_6c + fVar15 * fStack_60 + (fVar8 * fStack_74 - fVar15 * local_68);
  fVar19 = fVar15 * fStack_6c + fVar9 * local_68 + (fVar8 * fStack_70 - fVar15 * fStack_64);
  fVar20 = -(fVar9 * fStack_74 + fVar15 * fStack_60) + (fVar8 * fStack_6c - fVar15 * local_68);
  fVar8 = (((float)auVar11._0_8_ * 3.1415927) / 360.0) * 0.5;
  fVar9 = cosf(fVar8);
  fVar8 = sinf(fVar8);
  fVar15 = fVar8 * 0.0;
  local_88 = fVar8 * fVar20 + fVar15 * fVar18 + (fVar9 * fVar17 - fVar15 * fVar19);
  fStack_84 = fVar15 * fVar20 + fVar8 * fVar19 + (fVar9 * fVar18 - fVar15 * fVar17);
  fStack_80 = fVar15 * fVar20 + fVar15 * fVar17 + (fVar9 * fVar19 - fVar8 * fVar18);
  fStack_7c = -(fVar15 * fVar18 + fVar15 * fVar19) + (fVar9 * fVar20 - fVar8 * fVar17);
  Eigen::Matrix<float,3,3,0,3,3>::operator=
            (local_44,(RotationBase<Eigen::Quaternion<float,_0>,_3> *)&local_88);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Rotation Matrix: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar5 = (ostream *)std::ostream::flush();
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar14 = rand();
  local_88 = (float)(iVar14 % 200) / 10.0 + -10.0;
  iVar14 = rand();
  fStack_84 = (float)(iVar14 % 200) / 10.0 + -10.0;
  iVar14 = rand();
  fStack_80 = (float)(iVar14 % 200) / 10.0 + -10.0;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Translation Vector: ",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar5 = (ostream *)std::ostream::flush();
    local_50 = (RotationBase<Eigen::Quaternion<float,_0>,_3> *)&local_88;
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                       *)&local_50);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  lVar6 = 0;
  pfVar7 = (float *)__return_storage_ptr__;
  do {
    pfVar7[2] = *(float *)((long)afStack_3c + lVar6);
    *(undefined8 *)pfVar7 = *(undefined8 *)(local_44 + lVar6);
    lVar6 = lVar6 + 0xc;
    pfVar7 = pfVar7 + 4;
  } while (lVar6 != 0x24);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = fStack_80;
  *(ulong *)((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array + 0xc) = CONCAT44(fStack_84,local_88);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}